

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool __thiscall minihttp::HttpSocket::_EnqueueOrSend(HttpSocket *this,Request *req,bool forceQueue)

{
  bool bVar1;
  uint len;
  void *str;
  bool sent;
  bool forceQueue_local;
  Request *req_local;
  HttpSocket *this_local;
  
  if (((this->_inProgress & 1U) != 0) || (forceQueue)) {
    std::
    queue<minihttp::Request,_std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>_>::
    push(&this->_requestQ,req);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = _OpenRequest(this,req);
    if (bVar1) {
      str = (void *)std::__cxx11::string::c_str();
      len = std::__cxx11::string::length();
      this_local._7_1_ = TcpSocket::SendBytes(&this->super_TcpSocket,str,len);
      this->_inProgress = this_local._7_1_;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HttpSocket::_EnqueueOrSend(const Request& req, bool forceQueue /* = false */)
{
    traceprint("HttpSocket::_EnqueueOrSend, forceQueue = %d\n", forceQueue);
    if(_inProgress || forceQueue) // do not send while receiving other data
    {
        traceprint("HTTP: Transfer pending; putting into queue. Now %u waiting.\n", (unsigned int)_requestQ.size());
        _requestQ.push(req);
        return true;
    }
    // ok, we can send directly
    traceprint("HTTP: Open request for immediate send.\n");
    if(!_OpenRequest(req))
        return false;
    bool sent = SendBytes(req.header.c_str(), req.header.length());
    _inProgress = sent;
    return sent;
}